

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O0

int pcre2_jit_compile_16(pcre2_code_16 *code,uint32_t options)

{
  long *plVar1;
  int result;
  executable_functions *functions;
  pcre2_real_code_16 *re;
  uint32_t options_local;
  pcre2_code_16 *code_local;
  
  if (code == (pcre2_code_16 *)0x0) {
    code_local._4_4_ = -0x33;
  }
  else if ((options & 0xfffffff8) == 0) {
    if ((code->flags & 0x80000) == 0) {
      plVar1 = (long *)code->executable_jit;
      if (((((options & 1) == 0) ||
           (((plVar1 != (long *)0x0 && (*plVar1 != 0)) ||
            (code_local._4_4_ = jit_compile(code,1), code_local._4_4_ == 0)))) &&
          (((options & 2) == 0 ||
           (((plVar1 != (long *)0x0 && (plVar1[1] != 0)) ||
            (code_local._4_4_ = jit_compile(code,2), code_local._4_4_ == 0)))))) &&
         ((((options & 4) == 0 || ((plVar1 != (long *)0x0 && (plVar1[2] != 0)))) ||
          (code_local._4_4_ = jit_compile(code,4), code_local._4_4_ == 0)))) {
        code_local._4_4_ = 0;
      }
    }
    else {
      code_local._4_4_ = 0;
    }
  }
  else {
    code_local._4_4_ = -0x2d;
  }
  return code_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_jit_compile(pcre2_code *code, uint32_t options)
{
#ifndef SUPPORT_JIT

(void)code;
(void)options;
return PCRE2_ERROR_JIT_BADOPTION;

#else  /* SUPPORT_JIT */

pcre2_real_code *re = (pcre2_real_code *)code;
executable_functions *functions;
int result;

if (code == NULL)
  return PCRE2_ERROR_NULL;

if ((options & ~PUBLIC_JIT_COMPILE_OPTIONS) != 0)
  return PCRE2_ERROR_JIT_BADOPTION;

if ((re->flags & PCRE2_NOJIT) != 0) return 0;

functions = (executable_functions *)re->executable_jit;

if ((options & PCRE2_JIT_COMPLETE) != 0 && (functions == NULL
    || functions->executable_funcs[0] == NULL)) {
  result = jit_compile(code, PCRE2_JIT_COMPLETE);
  if (result != 0)
    return result;
  }

if ((options & PCRE2_JIT_PARTIAL_SOFT) != 0 && (functions == NULL
    || functions->executable_funcs[1] == NULL)) {
  result = jit_compile(code, PCRE2_JIT_PARTIAL_SOFT);
  if (result != 0)
    return result;
  }

if ((options & PCRE2_JIT_PARTIAL_HARD) != 0 && (functions == NULL
    || functions->executable_funcs[2] == NULL)) {
  result = jit_compile(code, PCRE2_JIT_PARTIAL_HARD);
  if (result != 0)
    return result;
  }

return 0;

#endif  /* SUPPORT_JIT */
}